

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test::
TestBody(MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test *this)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  char *pcVar3;
  char *in_R9;
  string local_388;
  AssertHelper local_368;
  Message local_360;
  bool local_351;
  undefined1 local_350 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_320;
  Message local_318;
  bool local_309;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  string local_128;
  FieldDescriptor *local_108;
  FieldDescriptor *rc;
  string local_f8;
  FieldDescriptor *local_d8;
  FieldDescriptor *c;
  undefined1 local_c0 [8];
  TestField msg2;
  TestField msg1;
  MessageDifferencerTest_IgnoreField_TrumpsCompareWithFields_Test *this_local;
  
  proto2_unittest::TestField::TestField((TestField *)((long)&msg2.field_0 + 0x40));
  proto2_unittest::TestField::TestField((TestField *)local_c0);
  proto2_unittest::TestField::set_c((TestField *)((long)&msg2.field_0 + 0x40),3);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),1);
  proto2_unittest::TestField::add_rc((TestField *)((long)&msg2.field_0 + 0x40),2);
  proto2_unittest::TestField::set_c((TestField *)local_c0,3);
  proto2_unittest::TestField::add_rc((TestField *)local_c0,1);
  proto2_unittest::TestField::add_rc((TestField *)local_c0,3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"c",(allocator<char> *)((long)&rc + 7));
  pFVar2 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&rc + 7));
  local_d8 = pFVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_128,"rc",
             (allocator<char> *)
             ((long)&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pFVar2 = GetFieldDescriptor((Message *)((long)&msg2.field_0 + 0x40),&local_128);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&fields.
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_108 = pFVar2;
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)&differencer.unpack_any_field_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&differencer.unpack_any_field_,&local_d8);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               *)&differencer.unpack_any_field_,&local_108);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::IgnoreField((MessageDifferencer *)&gtest_ar_.message_,local_108);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,FULL);
  local_309 = util::MessageDifferencer::CompareWithFields
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)((long)&msg2.field_0 + 0x40),(Message *)local_c0,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)&differencer.unpack_any_field_,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)&differencer.unpack_any_field_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_308,&local_309,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_318);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_308,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb0d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_320,&local_318);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_318);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,PARTIAL);
  local_351 = util::MessageDifferencer::CompareWithFields
                        ((MessageDifferencer *)&gtest_ar_.message_,
                         (Message *)((long)&msg2.field_0 + 0x40),(Message *)local_c0,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)&differencer.unpack_any_field_,
                         (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          *)&differencer.unpack_any_field_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_350,&local_351,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_350);
  if (!bVar1) {
    testing::Message::Message(&local_360);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_388,(internal *)local_350,
               (AssertionResult *)"differencer.CompareWithFields(msg1, msg2, fields, fields)",
               "false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb10,pcVar3);
    testing::internal::AssertHelper::operator=(&local_368,&local_360);
    testing::internal::AssertHelper::~AssertHelper(&local_368);
    std::__cxx11::string::~string((string *)&local_388);
    testing::Message::~Message(&local_360);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_350);
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)&differencer.unpack_any_field_);
  proto2_unittest::TestField::~TestField((TestField *)local_c0);
  proto2_unittest::TestField::~TestField((TestField *)((long)&msg2.field_0 + 0x40));
  return;
}

Assistant:

TEST(MessageDifferencerTest, IgnoreField_TrumpsCompareWithFields) {
  proto2_unittest::TestField msg1;
  proto2_unittest::TestField msg2;

  msg1.set_c(3);
  msg1.add_rc(1);
  msg1.add_rc(2);

  msg2.set_c(3);
  msg2.add_rc(1);
  msg2.add_rc(3);

  const FieldDescriptor* c = GetFieldDescriptor(msg1, "c");
  const FieldDescriptor* rc = GetFieldDescriptor(msg1, "rc");

  std::vector<const FieldDescriptor*> fields;
  fields.push_back(c);
  fields.push_back(rc);

  util::MessageDifferencer differencer;
  differencer.IgnoreField(rc);

  differencer.set_scope(util::MessageDifferencer::FULL);
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields, fields));

  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.CompareWithFields(msg1, msg2, fields, fields));
}